

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O2

cmCMakePath * __thiscall
cmCMakePath::Relative(cmCMakePath *__return_storage_ptr__,cmCMakePath *this,path *base)

{
  string sStack_58;
  path path;
  
  std::filesystem::__cxx11::path::lexically_relative(&path);
  std::filesystem::__cxx11::path::generic_string(&sStack_58,&path);
  cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&sStack_58,generic_format);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::filesystem::__cxx11::path::~path(&path);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath Relative(const cm::filesystem::path& base) const
  {
    auto path = this->Path.lexically_relative(base);
    // filesystem::path:lexically_relative use preferred_separator ('\') on
    // Windows) so convert back to '/'
    return path.generic_string();
  }